

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O3

void expression_eval(FILE *out,char *valueIn,_Bool returnString)

{
  undefined4 uVar1;
  FILE *out_00;
  int iVar2;
  char *pcVar3;
  pattern_analyse_t *ppVar4;
  s_pattern_match *psVar5;
  undefined7 in_register_00000011;
  long lVar6;
  pattern_type_t pVar7;
  char *__s;
  size_t __n;
  long lVar8;
  pattern_match_t *ppVar9;
  pattern_match_t *matches;
  regmatch_t match [2];
  pattern_analyse_t local_78;
  long local_70;
  undefined4 local_64;
  pattern_match_t *local_60;
  regmatch_t local_58;
  int local_50;
  int local_4c;
  char *local_48;
  FILE *local_40;
  pattern_match_t *local_38;
  
  local_78.hasEquation = false;
  local_78.hasOperator = false;
  local_78.hasString = false;
  local_78.hasVariable = false;
  local_78.hasInt = false;
  local_78.hasFloat = false;
  if ((*valueIn != '$') || (valueIn[1] != '{')) {
    return;
  }
  local_64 = (undefined4)CONCAT71(in_register_00000011,returnString);
  local_40 = out;
  local_48 = strdup(valueIn);
  __s = local_48 + 2;
  pcVar3 = strchr(__s,0x7d);
  *pcVar3 = '\0';
  psVar5 = (pattern_match_t *)0x0;
  ppVar9 = psVar5;
  do {
    local_60 = ppVar9;
    iVar2 = regexec((regex_t *)&regexFloat,__s,2,&local_58,0);
    local_38 = psVar5;
    if (iVar2 == 0) {
      pVar7 = FLOAT;
      ppVar4 = (pattern_analyse_t *)&local_78.hasFloat;
LAB_00105227:
      local_70 = 0;
LAB_00105230:
      ppVar4->hasString = true;
    }
    else {
      pVar7 = INT;
      iVar2 = regexec((regex_t *)&regexInt,__s,2,&local_58,0);
      if (iVar2 == 0) {
        ppVar4 = (pattern_analyse_t *)&local_78.hasInt;
        goto LAB_00105227;
      }
      iVar2 = regexec((regex_t *)&regexString,__s,2,&local_58,0);
      if (iVar2 == 0) {
        pVar7 = STRING;
        local_70 = 1;
        ppVar4 = &local_78;
        goto LAB_00105230;
      }
      iVar2 = regexec((regex_t *)&regexEquation,__s,2,&local_58,0);
      if (iVar2 == 0) {
        pVar7 = EQUATION;
        ppVar4 = (pattern_analyse_t *)&local_78.hasEquation;
        goto LAB_00105227;
      }
      iVar2 = regexec((regex_t *)&regexOperator,__s,2,&local_58,0);
      if (iVar2 == 0) {
        pVar7 = OPERATOR;
        ppVar4 = (pattern_analyse_t *)&local_78.hasOperator;
        goto LAB_00105227;
      }
      iVar2 = regexec((regex_t *)&regexVariable,__s,2,&local_58,0);
      if (iVar2 == 0) {
        pVar7 = VARIABLE;
        ppVar4 = (pattern_analyse_t *)&local_78.hasVariable;
        goto LAB_00105227;
      }
      iVar2 = regexec((regex_t *)&regexPopen,__s,2,&local_58,0);
      if (iVar2 == 0) {
        pVar7 = POPEN;
      }
      else {
        iVar2 = regexec((regex_t *)&regexPclose,__s,2,&local_58,0);
        if (iVar2 == 0) {
          pVar7 = PCLOSE;
        }
        else {
          iVar2 = regexec((regex_t *)&regexNot,__s,2,&local_58,0);
          if (iVar2 != 0) {
            iVar2 = regexec((regex_t *)&regexEmpty,__s,2,&local_58,0);
            out_00 = local_40;
            pcVar3 = local_48;
            uVar1 = local_64;
            ppVar9 = local_60;
            if (iVar2 != 0) {
              if (local_60 != (pattern_match_t *)0x0) {
                free(local_60);
              }
              ppVar9 = (pattern_match_t *)0x0;
            }
            builder_generateCode(out_00,ppVar9,&local_78,SUB41(uVar1,0));
            free(pcVar3);
            expression_free(ppVar9);
            return;
          }
          pVar7 = NOT;
        }
      }
      local_70 = 0;
    }
    psVar5 = (s_pattern_match *)malloc(0x18);
    lVar8 = (long)local_4c;
    lVar6 = (long)local_50;
    __n = lVar8 - lVar6;
    pcVar3 = (char *)calloc(1,__n + 1);
    psVar5->string = pcVar3;
    strncpy(pcVar3,__s + lVar6,__n);
    __s = __s + lVar8 + local_70;
    psVar5->type = pVar7;
    psVar5->next = (s_pattern_match *)0x0;
    ppVar9 = psVar5;
    if (local_60 != (pattern_match_t *)0x0) {
      local_38->next = psVar5;
      ppVar9 = local_60;
    }
  } while( true );
}

Assistant:

void expression_eval(FILE *out, char *valueIn, bool returnString) {
	pattern_analyse_t analysation;
	analysation.hasEquation = false;
	analysation.hasFloat = false;
	analysation.hasInt = false;
	analysation.hasOperator = false;
	analysation.hasString = false;
	analysation.hasVariable = false;

	char *tmp;
	if ( !strncmp(valueIn, "${", 2) ) {
		char *dup = strdup(valueIn);
		char *expr = dup;
		expr += 2;
		tmp = strchr(expr, '}');
		*tmp = '\0';

		pattern_match_t *matches = expression_extract(&analysation, expr);
		builder_generateCode(out, matches, &analysation, returnString);

		free(dup);
		expression_free(matches);
	}
}